

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

bool rw::writeChunkHeader(Stream *s,int32 type,int32 size)

{
  anon_struct_12_3_2a00130e buf;
  int32 local_c;
  int32 local_8;
  int local_4;
  
  if ((int)version < 0x31001) {
    local_4 = (int)version >> 8;
  }
  else {
    local_4 = ((version & 0x3f) << 0x10 | (version & 0x3ff00) << 0xe) + (uint)build + 0x40000000;
  }
  local_c = type;
  local_8 = size;
  (*s->_vptr_Stream[3])(s,&local_c,0xc);
  return true;
}

Assistant:

bool
writeChunkHeader(Stream *s, int32 type, int32 size)
{
	struct {
		int32 type, size;
		uint32 id;
	} buf = { type, size, libraryIDPack(version, build) };
	s->write32(&buf, 12);
	return true;
}